

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# FenceVkImpl.cpp
# Opt level: O1

Uint64 __thiscall Diligent::FenceVkImpl::InternalGetCompletedValue(FenceVkImpl *this)

{
  atomic<unsigned_long> *paVar1;
  VulkanLogicalDevice *this_00;
  _Elt_pointer pSVar2;
  ulong uVar3;
  VkResult VVar4;
  ulong uVar5;
  ulong uVar6;
  char (*in_RCX) [23];
  ulong uVar7;
  SyncPointData *Item;
  bool bVar8;
  string msg;
  string local_48;
  
  if ((this->m_TimelineSemaphore).m_VkObject != (VkSemaphore_T *)0x0) {
    FormatString<char[26],char[23]>
              (&local_48,(Diligent *)"Debug expression failed:\n",
               (char (*) [26])"!IsTimelineSemaphore()",in_RCX);
    DebugAssertionFailed
              (local_48._M_dataplus._M_p,"InternalGetCompletedValue",
               "/workspace/llm4binary/github/license_c_cmakelists/DiligentGraphics[P]DiligentCore/Graphics/GraphicsEngineVulkan/src/FenceVkImpl.cpp"
               ,0x81);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_48._M_dataplus._M_p != &local_48.field_2) {
      operator_delete(local_48._M_dataplus._M_p,local_48.field_2._M_allocated_capacity + 1);
    }
  }
  this_00 = (((this->super_FenceBase<Diligent::EngineVkImplTraits>).
              super_DeviceObjectBase<Diligent::IFenceVk,_Diligent::RenderDeviceVkImpl,_Diligent::FenceDesc>
             .m_pDevice)->m_LogicalVkDevice).
            super___shared_ptr<VulkanUtilities::VulkanLogicalDevice,_(__gnu_cxx::_Lock_policy)2>.
            _M_ptr;
  while ((pSVar2 = (this->m_SyncPoints).
                   super__Deque_base<Diligent::FenceVkImpl::SyncPointData,_std::allocator<Diligent::FenceVkImpl::SyncPointData>_>
                   ._M_impl.super__Deque_impl_data._M_start._M_cur,
         (this->m_SyncPoints).
         super__Deque_base<Diligent::FenceVkImpl::SyncPointData,_std::allocator<Diligent::FenceVkImpl::SyncPointData>_>
         ._M_impl.super__Deque_impl_data._M_finish._M_cur != pSVar2 &&
         (VVar4 = VulkanUtilities::VulkanLogicalDevice::GetFenceStatus
                            (this_00,(((pSVar2->SyncPoint).
                                       super___shared_ptr<Diligent::SyncPointVk,_(__gnu_cxx::_Lock_policy)2>
                                      ._M_ptr)->m_Fence).m_VkSyncObject), VVar4 == VK_SUCCESS))) {
    uVar3 = pSVar2->Value;
    uVar5 = (this->super_FenceBase<Diligent::EngineVkImplTraits>).m_LastCompletedFenceValue.
            super___atomic_base<unsigned_long>._M_i;
    do {
      uVar7 = uVar3;
      if (uVar3 < uVar5) {
        uVar7 = uVar5;
      }
      paVar1 = &(this->super_FenceBase<Diligent::EngineVkImplTraits>).m_LastCompletedFenceValue;
      LOCK();
      uVar6 = (paVar1->super___atomic_base<unsigned_long>)._M_i;
      bVar8 = uVar5 == uVar6;
      if (bVar8) {
        (paVar1->super___atomic_base<unsigned_long>)._M_i = uVar7;
        uVar6 = uVar5;
      }
      UNLOCK();
      uVar5 = uVar6;
    } while (!bVar8);
    std::
    deque<Diligent::FenceVkImpl::SyncPointData,_std::allocator<Diligent::FenceVkImpl::SyncPointData>_>
    ::pop_front(&this->m_SyncPoints);
  }
  return (this->super_FenceBase<Diligent::EngineVkImplTraits>).m_LastCompletedFenceValue.
         super___atomic_base<unsigned_long>._M_i;
}

Assistant:

Uint64 FenceVkImpl::InternalGetCompletedValue()
{
    VERIFY_EXPR(!IsTimelineSemaphore());

    const VulkanUtilities::VulkanLogicalDevice& LogicalDevice = m_pDevice->GetLogicalDevice();
    while (!m_SyncPoints.empty())
    {
        SyncPointData& Item = m_SyncPoints.front();

        VkResult status = LogicalDevice.GetFenceStatus(Item.SyncPoint->GetFence());
        if (status == VK_SUCCESS)
        {
            UpdateLastCompletedFenceValue(Item.Value);
            m_SyncPoints.pop_front();
        }
        else
        {
            break;
        }
    }

    return m_LastCompletedFenceValue.load();
}